

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeDValue cellOverlap(Rtree *pRtree,RtreeCell *p,RtreeCell *aCell,int nCell)

{
  float fVar1;
  float fVar2;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_80;
  double local_78;
  double local_70;
  RtreeDValue x2;
  RtreeDValue x1;
  RtreeDValue o;
  double dStack_30;
  int jj;
  RtreeDValue overlap;
  int ii;
  int nCell_local;
  RtreeCell *aCell_local;
  RtreeCell *p_local;
  Rtree *pRtree_local;
  
  dStack_30 = 0.0;
  overlap._0_4_ = 0;
  do {
    if (nCell <= overlap._0_4_) {
      return dStack_30;
    }
    x1 = 1.0;
    for (o._4_4_ = 0; o._4_4_ < (int)(uint)pRtree->nDim2; o._4_4_ = o._4_4_ + 2) {
      if (pRtree->eCoordType == '\0') {
        fVar1 = p->aCoord[o._4_4_].f;
      }
      else {
        fVar1 = (float)p->aCoord[o._4_4_].i;
      }
      if (pRtree->eCoordType == '\0') {
        fVar2 = aCell[overlap._0_4_].aCoord[o._4_4_].f;
      }
      else {
        fVar2 = (float)aCell[overlap._0_4_].aCoord[o._4_4_].i;
      }
      if (fVar1 <= fVar2) {
        if (pRtree->eCoordType == '\0') {
          local_80 = (double)aCell[overlap._0_4_].aCoord[o._4_4_].f;
        }
        else {
          local_80 = (double)aCell[overlap._0_4_].aCoord[o._4_4_].i;
        }
        local_78 = local_80;
      }
      else {
        if (pRtree->eCoordType == '\0') {
          local_70 = (double)p->aCoord[o._4_4_].f;
        }
        else {
          local_70 = (double)p->aCoord[o._4_4_].i;
        }
        local_78 = local_70;
      }
      if (pRtree->eCoordType == '\0') {
        fVar1 = p->aCoord[o._4_4_ + 1].f;
      }
      else {
        fVar1 = (float)p->aCoord[o._4_4_ + 1].i;
      }
      if (pRtree->eCoordType == '\0') {
        fVar2 = aCell[overlap._0_4_].aCoord[o._4_4_ + 1].f;
      }
      else {
        fVar2 = (float)aCell[overlap._0_4_].aCoord[o._4_4_ + 1].i;
      }
      if (fVar2 <= fVar1) {
        if (pRtree->eCoordType == '\0') {
          local_b0 = (double)aCell[overlap._0_4_].aCoord[o._4_4_ + 1].f;
        }
        else {
          local_b0 = (double)aCell[overlap._0_4_].aCoord[o._4_4_ + 1].i;
        }
        local_a8 = local_b0;
      }
      else {
        if (pRtree->eCoordType == '\0') {
          local_a0 = (double)p->aCoord[o._4_4_ + 1].f;
        }
        else {
          local_a0 = (double)p->aCoord[o._4_4_ + 1].i;
        }
        local_a8 = local_a0;
      }
      if (local_a8 < local_78) {
        x1 = 0.0;
        break;
      }
      x1 = x1 * (local_a8 - local_78);
    }
    dStack_30 = x1 + dStack_30;
    overlap._0_4_ = overlap._0_4_ + 1;
  } while( true );
}

Assistant:

static RtreeDValue cellOverlap(
  Rtree *pRtree, 
  RtreeCell *p, 
  RtreeCell *aCell, 
  int nCell
){
  int ii;
  RtreeDValue overlap = RTREE_ZERO;
  for(ii=0; ii<nCell; ii++){
    int jj;
    RtreeDValue o = (RtreeDValue)1;
    for(jj=0; jj<pRtree->nDim2; jj+=2){
      RtreeDValue x1, x2;
      x1 = MAX(DCOORD(p->aCoord[jj]), DCOORD(aCell[ii].aCoord[jj]));
      x2 = MIN(DCOORD(p->aCoord[jj+1]), DCOORD(aCell[ii].aCoord[jj+1]));
      if( x2<x1 ){
        o = (RtreeDValue)0;
        break;
      }else{
        o = o * (x2-x1);
      }
    }
    overlap += o;
  }
  return overlap;
}